

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O0

char ** apprun_adjust_string_array_size(char **array)

{
  char **ppcVar1;
  bool bVar2;
  char **local_38;
  char **new_itr;
  char **orginal_itr;
  char **new;
  char **itr;
  uint new_capacity;
  char **array_local;
  
  itr._4_4_ = 1;
  new = array;
  while( true ) {
    bVar2 = false;
    if (new != (char **)0x0) {
      bVar2 = *new != (char *)0x0;
    }
    if (!bVar2) break;
    itr._4_4_ = itr._4_4_ + 1;
    new = new + 1;
  }
  ppcVar1 = (char **)calloc((ulong)itr._4_4_,8);
  local_38 = ppcVar1;
  new_itr = array;
  while( true ) {
    bVar2 = false;
    if (new_itr != (char **)0x0) {
      bVar2 = *new_itr != (char *)0x0;
    }
    if (!bVar2) break;
    *local_38 = *new_itr;
    new_itr = new_itr + 1;
    local_38 = local_38 + 1;
  }
  free(array);
  return ppcVar1;
}

Assistant:

char **apprun_adjust_string_array_size(char **array) {
    unsigned new_capacity = 1;
    for (char **itr = array; itr != NULL && *itr != NULL; itr++)
        new_capacity++;

    char **new = calloc(new_capacity, sizeof(char *));

    char **orginal_itr = array;
    char **new_itr = new;

    for (; orginal_itr != NULL && *orginal_itr != NULL; orginal_itr++, new_itr++)
        *new_itr = *orginal_itr;

    free(array);
    return new;
}